

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decimal_cast.cpp
# Opt level: O2

bool duckdb::TemplatedDecimalScaleDown<duckdb::hugeint_t,short,duckdb::Hugeint>
               (Vector *source,Vector *result,idx_t count,CastParameters *parameters)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  ulong uVar5;
  long lVar6;
  DecimalScaleInput<duckdb::hugeint_t,_duckdb::hugeint_t> input;
  Vector *local_78;
  Vector *local_70;
  CastParameters *local_68;
  undefined1 local_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 local_40;
  byte local_38;
  byte local_37;
  
  bVar1 = DecimalType::GetScale(&source->type);
  bVar2 = DecimalType::GetWidth(&source->type);
  bVar3 = DecimalType::GetScale(&result->type);
  bVar4 = DecimalType::GetWidth(&result->type);
  uVar5 = (ulong)bVar4 + ((ulong)bVar1 - (ulong)bVar3);
  lVar6 = ((ulong)bVar1 - (ulong)bVar3) * 0x10;
  local_48 = *(undefined8 *)(Hugeint::POWERS_OF_TEN + lVar6);
  local_40 = *(undefined8 *)(Hugeint::POWERS_OF_TEN + lVar6 + 8);
  local_78 = result;
  local_70 = result;
  local_68 = parameters;
  if (bVar2 < uVar5) {
    local_60 = 1;
    UnaryExecutor::GenericExecute<duckdb::hugeint_t,short,duckdb::DecimalScaleDownOperator>
              (source,result,count,&local_78,false);
    local_60 = 1;
  }
  else {
    lVar6 = uVar5 * 0x10;
    local_60 = 1;
    local_58 = *(undefined8 *)(Hugeint::POWERS_OF_TEN + lVar6);
    uStack_50 = *(undefined8 *)(Hugeint::POWERS_OF_TEN + lVar6 + 8);
    local_38 = bVar2;
    local_37 = bVar1;
    UnaryExecutor::GenericExecute<duckdb::hugeint_t,short,duckdb::DecimalScaleDownCheckOperator>
              (source,result,count,&local_78,parameters->error_message != (string *)0x0);
  }
  return (bool)local_60;
}

Assistant:

bool TemplatedDecimalScaleDown(Vector &source, Vector &result, idx_t count, CastParameters &parameters) {
	auto source_scale = DecimalType::GetScale(source.GetType());
	auto source_width = DecimalType::GetWidth(source.GetType());
	auto result_scale = DecimalType::GetScale(result.GetType());
	auto result_width = DecimalType::GetWidth(result.GetType());
	D_ASSERT(result_scale < source_scale);
	idx_t scale_difference = source_scale - result_scale;
	idx_t target_width = result_width + scale_difference;
	auto divide_factor = UnsafeNumericCast<SOURCE>(POWERS_SOURCE::POWERS_OF_TEN[scale_difference]);
	if (source_width < target_width) {
		DecimalScaleInput<SOURCE> input(result, divide_factor, parameters);
		// type will always fit: no need to check limit
		UnaryExecutor::GenericExecute<SOURCE, DEST, DecimalScaleDownOperator>(source, result, count, &input);
		return true;
	} else {
		// type might not fit: check limit
		auto limit = UnsafeNumericCast<SOURCE>(POWERS_SOURCE::POWERS_OF_TEN[target_width]);
		DecimalScaleInput<SOURCE> input(result, limit, divide_factor, parameters, source_width, source_scale);
		UnaryExecutor::GenericExecute<SOURCE, DEST, DecimalScaleDownCheckOperator>(source, result, count, &input,
		                                                                           parameters.error_message);
		return input.vector_cast_data.all_converted;
	}
}